

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::TraverseSchema::traverseRedefine(TraverseSchema *this,DOMElement *redefineElem)

{
  SchemaInfo *pSVar1;
  SchemaInfo *pSVar2;
  NamespaceScopeManager nsMgr;
  NamespaceScopeManager NStack_28;
  
  NamespaceScopeManager::NamespaceScopeManager(&NStack_28,redefineElem,this->fSchemaInfo,this);
  pSVar1 = this->fSchemaInfo;
  pSVar2 = RefHashTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::PtrHasher>::get
                     (this->fPreprocessedNodes,redefineElem);
  if (pSVar2 != (SchemaInfo *)0x0) {
    this->fSchemaInfo = pSVar2;
    processChildren(this,pSVar2->fSchemaRootElement);
    this->fSchemaInfo = pSVar1;
    processChildren(this,redefineElem);
  }
  NamespaceScopeManager::~NamespaceScopeManager(&NStack_28);
  return;
}

Assistant:

void TraverseSchema::traverseRedefine(const DOMElement* const redefineElem) {

    NamespaceScopeManager nsMgr(redefineElem, fSchemaInfo, this);

    SchemaInfo* saveInfo = fSchemaInfo;
    SchemaInfo* redefinedInfo = fPreprocessedNodes->get(redefineElem);

    if (redefinedInfo) {

        // Now we have to march through our nicely-renamed schemas. When
        // we do these traversals other <redefine>'s may perhaps be
        // encountered; we leave recursion to sort this out.
        fSchemaInfo = redefinedInfo;
        processChildren(fSchemaInfo->getRoot());
        fSchemaInfo = saveInfo;

        // Now traverse our own <redefine>
        processChildren(redefineElem);
    }
}